

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.cpp
# Opt level: O3

string * duckdb::ParseInfo::QualifierToString
                   (string *__return_storage_ptr__,string *catalog,string *schema,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (catalog->_M_string_length == 0) {
    if ((schema->_M_string_length == 0) ||
       (iVar2 = ::std::__cxx11::string::compare((char *)schema), iVar2 == 0)) goto LAB_00e40c87;
    KeywordHelper::WriteOptionallyQuoted(&local_50,schema,'\"',true);
    puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_50);
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = puVar4[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_70._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00e40c87;
  }
  else {
    KeywordHelper::WriteOptionallyQuoted(&local_50,catalog,'\"',true);
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_50);
    paVar1 = &local_70.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (schema->_M_string_length == 0) goto LAB_00e40c87;
    KeywordHelper::WriteOptionallyQuoted(&local_50,schema,'\"',true);
    puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_50);
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = puVar4[3];
      local_70._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_70._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00e40c87;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_00e40c87:
  KeywordHelper::WriteOptionallyQuoted(&local_70,name,'\"',true);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ParseInfo::QualifierToString(const string &catalog, const string &schema, const string &name) {
	string result;
	if (!catalog.empty()) {
		result += KeywordHelper::WriteOptionallyQuoted(catalog) + ".";
		if (!schema.empty()) {
			result += KeywordHelper::WriteOptionallyQuoted(schema) + ".";
		}
	} else if (!schema.empty() && schema != DEFAULT_SCHEMA) {
		result += KeywordHelper::WriteOptionallyQuoted(schema) + ".";
	}
	result += KeywordHelper::WriteOptionallyQuoted(name);
	return result;
}